

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_t5_enc::llm_build_t5_enc
          (llm_build_t5_enc *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  int iVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  int extraout_var;
  ggml_backend_buffer *name;
  const_reference pvVar6;
  ggml_tensor *cur_00;
  ggml_tensor *pgVar7;
  pointer plVar8;
  ggml_tensor *in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *kq_b;
  ggml_tensor *attn_rel_b;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_no_cache *inp_attn;
  ggml_tensor *pos_bucket_enc;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffdf8;
  int iVar9;
  int il_00;
  llm_graph_context *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffe18;
  undefined4 uVar10;
  ggml_tensor *cur_01;
  llm_graph_context *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe58;
  int32_t in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  ggml_tensor *in_stack_fffffffffffffe68;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *in_stack_fffffffffffffe80;
  int32_t in_stack_fffffffffffffe88;
  int32_t in_stack_fffffffffffffe8c;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffe98;
  int il_01;
  ggml_tensor *in_stack_fffffffffffffea0;
  ggml_tensor *gate_b;
  ggml_tensor *in_stack_fffffffffffffeb8;
  ggml_tensor *in_stack_fffffffffffffec0;
  ggml_tensor *in_stack_fffffffffffffec8;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_ffffffffffffff08;
  llm_graph_context *in_stack_ffffffffffffff10;
  ggml_tensor *local_70;
  int local_64;
  ggml_tensor *local_50;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffe10,
             (llm_graph_params *)in_stack_fffffffffffffe08);
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0x24);
  if (iVar1 != *(int *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x28dd,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_50 = llm_graph_context::build_inp_embd(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  llm_graph_context::build_inp_pos_bucket_enc((llm_graph_context *)in_stack_fffffffffffffe50);
  pgVar2 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_no_cache
                     ((llm_graph_context *)in_stack_fffffffffffffe70);
  for (local_64 = 0; il_01 = (int)in_stack_fffffffffffffea0,
      iVar9 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
      (long)local_64 < *(long *)(in_RDI + 0x28); local_64 = local_64 + 1) {
    local_70 = local_50;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    llm_graph_context::build_norm
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08,(llm_norm_type)((ulong)in_stack_fffffffffffffe00 >> 0x20),
               (int)in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar9);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar3 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar9);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar9);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar5 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar9);
    ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar3,iVar1,*(undefined8 *)(in_RDI + 0x48),
                    (long)*(int *)(in_RDI + 0xa8));
    ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar4,iVar1,*(undefined8 *)(in_RDI + 0x50),
                    (long)*(int *)(in_RDI + 0xa8));
    name = (ggml_backend_buffer *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar5,iVar1,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    if (pvVar6->attn_rel_b_enc == (ggml_tensor *)0x0) {
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),0);
      iVar9 = (int)pvVar6->attn_rel_b_enc;
    }
    else {
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      iVar9 = (int)pvVar6->attn_rel_b_enc;
    }
    cur_00 = llm_graph_context::build_pos_bias
                       (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe10);
    uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe18 >> 0x20);
    pgVar3 = pgVar2;
    pgVar4 = in_RCX;
    pgVar5 = cur_00;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    type_gate = (llm_ffn_gate_type)pgVar5;
    cur_01 = (ggml_tensor *)CONCAT44(uVar10,local_64);
    mw = (ggml_tensor *)0x0;
    il_00 = extraout_var;
    local_48 = llm_graph_context::build_attn
                         ((llm_graph_context *)in_stack_fffffffffffffe70,
                          (llm_graph_input_attn_no_cache *)in_stack_fffffffffffffe68,
                          (ggml_cgraph *)
                          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe48,in_stack_fffffffffffffe80,
                          (ggml_tensor *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                          (float)(in_stack_fffffffffffffe40 >> 0x20),il_01);
    pgVar5 = local_48;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    type_op = (llm_ffn_op_type)pgVar5;
    if ((long)local_64 == *(long *)(in_RDI + 0x28) + -1) {
      pgVar5 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffec8 = pgVar5;
      local_48 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_48,pgVar5);
      in_stack_fffffffffffffec0 = local_48;
      in_stack_fffffffffffffeb8 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_50,pgVar5);
      local_70 = in_stack_fffffffffffffeb8;
    }
    pgVar7 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_48,local_70);
    gate_b = pgVar7;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    in_stack_fffffffffffffea0 = pgVar7;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    in_stack_fffffffffffffe70 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffe20,cur_01,mw,cur_00,(llm_norm_type)((ulong)name >> 0x20),
                    (int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar5 = pvVar6->ffn_up_enc;
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    in_stack_fffffffffffffe80 = pvVar6->ffn_gate_enc;
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    in_stack_fffffffffffffe08 = pvVar6->ffn_down_enc;
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    in_stack_fffffffffffffe8c = 0;
    in_stack_fffffffffffffe64 = (pvVar6->ffn_gate_enc == (ggml_tensor *)0x0) + 1;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    in_stack_fffffffffffffe20 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffe18 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe10 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe00 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdf8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe68 = in_stack_fffffffffffffe08;
    in_stack_fffffffffffffe90 = (ggml_tensor *)&stack0xfffffffffffffdf8;
    pgVar3 = llm_graph_context::build_ffn
                       ((llm_graph_context *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        (ggml_tensor *)&stack0xfffffffffffffdf8,
                        (ggml_tensor *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                        ,in_stack_fffffffffffffe80,pgVar5,gate_b,in_stack_fffffffffffffeb8,
                        in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,pgVar3,pgVar4,type_op,
                        type_gate,iVar9);
    in_stack_fffffffffffffe98 = pgVar3;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    in_stack_fffffffffffffe58 =
         (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar3,pgVar7);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    local_50 = llm_graph_context::build_cvec(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,0);
    in_stack_fffffffffffffe50 = local_50;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  }
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (char *)in_stack_fffffffffffffe00,iVar9);
  pgVar3 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe08,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                      (int)in_stack_fffffffffffffe00);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (char *)in_stack_fffffffffffffe00,iVar9);
  pgVar2 = pgVar3;
  plVar8 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                     ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                      0x4f31d1);
  plVar8->t_embd = pgVar2;
  ggml_build_forward_expand(in_RCX,pgVar3);
  return;
}

Assistant:

llm_build_t5_enc(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        ggml_tensor * pos_bucket_enc = build_inp_pos_bucket_enc();

        auto * inp_attn = build_attn_inp_no_cache();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm_enc, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq_enc, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk_enc, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv_enc, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                ggml_tensor * attn_rel_b = model.layers[il].attn_rel_b_enc ? model.layers[il].attn_rel_b_enc : model.layers[0].attn_rel_b_enc;
                ggml_tensor * kq_b = build_pos_bias(pos_bucket_enc, attn_rel_b);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo_enc, nullptr,
                        Qcur, Kcur, Vcur, kq_b, nullptr, 1.0f, il);
                cb(cur, "kqv_out", il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm_enc, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                // T5 uses relu, flan-T5 uses gelu-gated
                cur = build_ffn(cur,
                        model.layers[il].ffn_up_enc,   NULL, NULL,
                        model.layers[il].ffn_gate_enc, NULL, NULL,
                        model.layers[il].ffn_down_enc, NULL, NULL,
                        NULL,
                        model.layers[il].ffn_gate_enc ? LLM_FFN_GELU : LLM_FFN_RELU,
                        model.layers[il].ffn_gate_enc ? LLM_FFN_PAR  : LLM_FFN_SEQ,
                        il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;
        cb(cur, "result_embd", -1);

        cur = build_norm(cur,
                model.output_norm_enc, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        ggml_build_forward_expand(gf, cur);
    }